

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::PortBundleDefinition::add_definition
          (PortBundleDefinition *this,string *name,uint32_t width,uint32_t size,bool is_signed,
          PortDirection direction,PortType type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  UserException *pUVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>,_bool>
  pVar4;
  tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> local_d0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  PortDirection local_94;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>
  _Stack_90;
  PortDirection dir;
  undefined1 local_88;
  tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType> local_7c;
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Self local_38;
  _Self local_30;
  PortDirection local_28;
  bool local_21;
  PortDirection direction_local;
  uint32_t uStack_1c;
  bool is_signed_local;
  uint32_t size_local;
  uint32_t width_local;
  string *name_local;
  PortBundleDefinition *this_local;
  
  local_28 = direction;
  local_21 = is_signed;
  direction_local = size;
  uStack_1c = width;
  _size_local = name;
  name_local = &this->name_;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
       ::find(&this->definitions_,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<unsigned_int,_unsigned_int,_bool,_kratos::PortDirection,_kratos::PortType>_>_>_>
       ::end(&this->definitions_);
  bVar2 = std::operator!=(&local_30,&local_38);
  pbVar1 = _size_local;
  if (bVar2) {
    local_65 = 1;
    pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
    std::operator+(&local_58,_size_local," already exists");
    UserException::UserException(pUVar3,&local_58);
    local_65 = 0;
    __cxa_throw(pUVar3,&UserException::typeinfo,UserException::~UserException);
  }
  std::make_tuple<unsigned_int&,unsigned_int&,bool&,kratos::PortDirection&,kratos::PortType&>
            (&local_7c,&stack0xffffffffffffffe4,&direction_local,&local_21,&local_28,&type);
  pVar4 = std::
          map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
          ::
          emplace<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
                    ((map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
                      *)&this->definitions_,pbVar1,&local_7c);
  pbVar1 = _size_local;
  _Stack_90 = pVar4.first._M_node;
  local_88 = pVar4.second;
  if (local_28 == In) {
    local_94 = Out;
  }
  else {
    if (local_28 != Out) {
      local_ba = 1;
      pUVar3 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"PortBundle doesn\'t allow inout",&local_b9);
      UserException::UserException(pUVar3,&local_b8);
      local_ba = 0;
      __cxa_throw(pUVar3,&UserException::typeinfo,UserException::~UserException);
    }
    local_94 = In;
  }
  std::make_tuple<unsigned_int&,unsigned_int&,bool&,kratos::PortDirection&,kratos::PortType&>
            (&local_d0,&stack0xffffffffffffffe4,&direction_local,&local_21,&local_94,&type);
  std::
  map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
  ::
  emplace<std::__cxx11::string_const&,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>
            ((map<std::__cxx11::string,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::tuple<unsigned_int,unsigned_int,bool,kratos::PortDirection,kratos::PortType>>>>
              *)&this->flipped_definitions_,pbVar1,&local_d0);
  return;
}

Assistant:

void PortBundleDefinition::add_definition(const std::string& name, uint32_t width, uint32_t size,
                                          bool is_signed, kratos::PortDirection direction,
                                          kratos::PortType type) {
    if (definitions_.find(name) != definitions_.end())
        throw UserException(name + " already exists");
    definitions_.emplace(name, std::make_tuple(width, size, is_signed, direction, type));
    PortDirection dir;
    if (direction == PortDirection::In) {
        dir = PortDirection::Out;
    } else if (direction == PortDirection::Out) {
        dir = PortDirection::In;
    } else {
        throw UserException("PortBundle doesn't allow inout");
    }
    flipped_definitions_.emplace(name, std::make_tuple(width, size, is_signed, dir, type));
}